

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilityEval.cpp
# Opt level: O3

string2double * __thiscall
ProbabilityEval::nextProbsSequence_abi_cxx11_
          (string2double *__return_storage_ptr__,ProbabilityEval *this)

{
  string *this_00;
  double dVar1;
  Node *pNVar2;
  Node *pNVar3;
  NodePtr pDVar4;
  uint uVar5;
  ulong *puVar6;
  size_t sVar7;
  type pTVar8;
  type pdVar10;
  ulong uVar11;
  ulong *puVar12;
  uint8_t *puVar13;
  NodePtr pDVar14;
  iterator iVar15;
  iterator iVar16;
  string seqpart;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *pcVar9;
  
  update_cb(this);
  this_00 = &this->seq;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_50,this_00,(long)this->start,0xffffffffffffffff);
  pNVar2 = (this->updatedDict).mKeyVals;
  sVar7 = robin_hood::detail::
          Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::findIdx<std::__cxx11::string>
                    ((Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)&this->updatedDict,&local_50);
  pNVar3 = (Node *)(this->updatedDict).mInfo;
  __return_storage_ptr__->mHashMultiplier = 0xc4ceb9fe1a85ec53;
  __return_storage_ptr__->mKeyVals = (Node *)&__return_storage_ptr__->mMask;
  __return_storage_ptr__->mInfo = (uint8_t *)&__return_storage_ptr__->mMask;
  __return_storage_ptr__->mNumElements = 0;
  __return_storage_ptr__->mMask = 0;
  __return_storage_ptr__->mMaxNumElementsAllowed = 0;
  __return_storage_ptr__->mInfoInc = 0x20;
  __return_storage_ptr__->mInfoHashShift = 0;
  if (pNVar2 + sVar7 == pNVar3) {
    pTVar8 = robin_hood::detail::
             Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
             ::
             operator[]<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>>
                       ((Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                         *)this->probDict,&local_50);
    iVar16 = robin_hood::detail::
             Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
             begin(pTVar8);
    pcVar9 = (char *)iVar16.mKeyVals;
    pDVar4 = (NodePtr)pTVar8->mInfo;
    while ((NodePtr)pcVar9 != pDVar4) {
      puVar13 = iVar16.mInfo;
      pDVar14 = iVar16.mKeyVals;
      dVar1 = (pDVar14->mData).second;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (this_00,(pDVar14->mData).first);
      pdVar10 = robin_hood::detail::
                Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]<double>(__return_storage_ptr__,this_00);
      pDVar14 = pDVar14 + 1;
      *pdVar10 = dVar1;
      uVar11 = *(ulong *)(puVar13 + 1);
      if (uVar11 == 0) {
        puVar6 = (ulong *)(puVar13 + 9);
        do {
          puVar12 = puVar6;
          uVar11 = *puVar12;
          pDVar14 = pDVar14 + 8;
          puVar6 = puVar12 + 1;
        } while (uVar11 == 0);
      }
      else {
        puVar12 = (ulong *)(puVar13 + 1);
      }
      uVar5 = 0;
      for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
        uVar5 = uVar5 + 1;
      }
      pcVar9 = &(pDVar14->mData).first + ((uVar5 >> 3) << 4);
      iVar16.mInfo = (uint8_t *)((long)puVar12 + (ulong)(uVar5 >> 3));
      iVar16.mKeyVals = (NodePtr)pcVar9;
    }
  }
  else {
    pTVar8 = robin_hood::detail::
             Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
             ::
             operator[]<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>>
                       ((Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                         *)&this->updatedDict,&local_50);
    iVar15 = robin_hood::detail::
             Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
             begin(pTVar8);
    pcVar9 = (char *)iVar15.mKeyVals;
    pDVar4 = (NodePtr)pTVar8->mInfo;
    while ((NodePtr)pcVar9 != pDVar4) {
      puVar13 = iVar15.mInfo;
      pDVar14 = iVar15.mKeyVals;
      dVar1 = (pDVar14->mData).second;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (this_00,(pDVar14->mData).first);
      pdVar10 = robin_hood::detail::
                Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]<double>(__return_storage_ptr__,this_00);
      pDVar14 = pDVar14 + 1;
      *pdVar10 = dVar1;
      uVar11 = *(ulong *)(puVar13 + 1);
      if (uVar11 == 0) {
        puVar6 = (ulong *)(puVar13 + 9);
        do {
          puVar12 = puVar6;
          uVar11 = *puVar12;
          pDVar14 = pDVar14 + 8;
          puVar6 = puVar12 + 1;
        } while (uVar11 == 0);
      }
      else {
        puVar12 = (ulong *)(puVar13 + 1);
      }
      uVar5 = 0;
      for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
        uVar5 = uVar5 + 1;
      }
      pcVar9 = &(pDVar14->mData).first + ((uVar5 >> 3) << 4);
      iVar15.mInfo = (uint8_t *)((long)puVar12 + (ulong)(uVar5 >> 3));
      iVar15.mKeyVals = (NodePtr)pcVar9;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string2double ProbabilityEval::nextProbsSequence() {
    update_cb();
    string seqpart = seq.substr(start);
    if (updatedDict.count(seqpart)){
        string2double res;
        for (const auto &[key, value]: updatedDict[seqpart]) {
            res[seq += key] = value;
        }
        return res;
    } else {
        string2double res;
        for (const auto &[key, value]: (*probDict)[seqpart]) {
            res[seq += key] = value;
        }
        return res;
    }
}